

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_lsrkstep.c
# Opt level: O2

void * lsrkStep_Create_Commons(ARKRhsFn rhs,sunrealtype t0,N_Vector y0,SUNContext_conflict sunctx)

{
  int iVar1;
  ARKodeMem ark_mem_00;
  undefined8 *puVar2;
  int iVar3;
  char *pcVar4;
  ARKodeMem ark_mem;
  sunrealtype local_28;
  
  if (rhs == (ARKRhsFn)0x0) {
    pcVar4 = "Must specify at least one of fe, fi (both NULL).";
    iVar1 = -0x16;
    iVar3 = 0x81;
  }
  else if (y0 == (N_Vector)0x0) {
    pcVar4 = "y0 = NULL illegal.";
    iVar1 = -0x16;
    iVar3 = 0x89;
  }
  else if (sunctx == (SUNContext_conflict)0x0) {
    pcVar4 = "sunctx = NULL illegal.";
    iVar1 = -0x16;
    iVar3 = 0x90;
  }
  else {
    local_28 = t0;
    ark_mem_00 = arkCreate(sunctx);
    if (ark_mem_00 != (ARKodeMem)0x0) {
      ark_mem = ark_mem_00;
      puVar2 = (undefined8 *)calloc(1,0xa8);
      if (puVar2 == (undefined8 *)0x0) {
        pcVar4 = "Allocation of arkode_mem failed.";
        iVar1 = -0x14;
        iVar3 = 0xa2;
      }
      else {
        ark_mem_00->step_init = lsrkStep_Init;
        ark_mem_00->step_fullrhs = lsrkStep_FullRHS;
        ark_mem_00->step = lsrkStep_TakeStepRKC;
        ark_mem_00->step_printallstats = lsrkStep_PrintAllStats;
        ark_mem_00->step_writeparameters = lsrkStep_WriteParameters;
        ark_mem_00->step_free = lsrkStep_Free;
        ark_mem_00->step_printmem = lsrkStep_PrintMem;
        ark_mem_00->step_setdefaults = lsrkStep_SetDefaults;
        ark_mem_00->step_getnumrhsevals = lsrkStep_GetNumRhsEvals;
        ark_mem_00->step_getestlocalerrors = lsrkStep_GetEstLocalErrors;
        ark_mem_00->step_mem = puVar2;
        ark_mem_00->step_supports_adaptive = 1;
        iVar1 = lsrkStep_SetDefaults(ark_mem_00);
        if (iVar1 == 0) {
          *puVar2 = rhs;
          puVar2[1] = 0;
          puVar2[4] = 0;
          puVar2[5] = 0;
          puVar2[6] = 0xc800000000;
          puVar2[7] = 0;
          iVar1 = arkInit(ark_mem_00,local_28,y0,0);
          if (iVar1 == 0) {
            ARKodeSetInterpolantType(ark_mem_00,1);
            return ark_mem_00;
          }
          pcVar4 = "Unable to initialize main ARKODE infrastructure";
          iVar3 = 0xd1;
        }
        else {
          pcVar4 = "Error setting default solver options";
          iVar3 = 0xba;
        }
      }
      arkProcessError(ark_mem_00,iVar1,iVar3,"lsrkStep_Create_Commons",
                      "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_lsrkstep.c"
                      ,pcVar4);
      ARKodeFree(&ark_mem);
      return (void *)0x0;
    }
    pcVar4 = "arkode_mem = NULL illegal.";
    iVar1 = -0x15;
    iVar3 = 0x99;
    ark_mem = (ARKodeMem)0x0;
  }
  arkProcessError((ARKodeMem)0x0,iVar1,iVar3,"lsrkStep_Create_Commons",
                  "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_lsrkstep.c"
                  ,pcVar4);
  return (void *)0x0;
}

Assistant:

void* lsrkStep_Create_Commons(ARKRhsFn rhs, sunrealtype t0, N_Vector y0,
                              SUNContext sunctx)
{
  ARKodeMem ark_mem;
  ARKodeLSRKStepMem step_mem;
  int retval;

  /* Check that rhs is supplied */
  if (rhs == NULL)
  {
    arkProcessError(NULL, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSG_ARK_NULL_F);
    return NULL;
  }

  /* Check for legal input parameters */
  if (y0 == NULL)
  {
    arkProcessError(NULL, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSG_ARK_NULL_Y0);
    return NULL;
  }

  if (sunctx == NULL)
  {
    arkProcessError(NULL, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSG_ARK_NULL_SUNCTX);
    return NULL;
  }

  /* Create ark_mem structure and set default values */
  ark_mem = arkCreate(sunctx);
  if (ark_mem == NULL)
  {
    arkProcessError(NULL, ARK_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSG_ARK_NO_MEM);
    return NULL;
  }

  /* Allocate ARKodeLSRKStepMem structure, and initialize to zero */
  step_mem = (ARKodeLSRKStepMem)calloc(1, sizeof(*step_mem));
  if (step_mem == NULL)
  {
    arkProcessError(ark_mem, ARK_MEM_FAIL, __LINE__, __func__, __FILE__,
                    MSG_ARK_ARKMEM_FAIL);
    ARKodeFree((void**)&ark_mem);
    return NULL;
  }

  /* Attach step_mem structure and function pointers to ark_mem */
  ark_mem->step_init              = lsrkStep_Init;
  ark_mem->step_fullrhs           = lsrkStep_FullRHS;
  ark_mem->step                   = lsrkStep_TakeStepRKC;
  ark_mem->step_printallstats     = lsrkStep_PrintAllStats;
  ark_mem->step_writeparameters   = lsrkStep_WriteParameters;
  ark_mem->step_free              = lsrkStep_Free;
  ark_mem->step_printmem          = lsrkStep_PrintMem;
  ark_mem->step_setdefaults       = lsrkStep_SetDefaults;
  ark_mem->step_getnumrhsevals    = lsrkStep_GetNumRhsEvals;
  ark_mem->step_getestlocalerrors = lsrkStep_GetEstLocalErrors;
  ark_mem->step_mem               = (void*)step_mem;
  ark_mem->step_supports_adaptive = SUNTRUE;

  /* Set default values for optional inputs */
  retval = lsrkStep_SetDefaults((void*)ark_mem);
  if (retval != ARK_SUCCESS)
  {
    arkProcessError(ark_mem, retval, __LINE__, __func__, __FILE__,
                    "Error setting default solver options");
    ARKodeFree((void**)&ark_mem);
    return NULL;
  }

  /* Copy the input parameters into ARKODE state */
  step_mem->fe = rhs;

  /* Set NULL for dom_eig_fn */
  step_mem->dom_eig_fn = NULL;

  /* Initialize all the counters */
  step_mem->nfe               = 0;
  step_mem->stage_max         = 0;
  step_mem->dom_eig_num_evals = 0;
  step_mem->stage_max_limit   = STAGE_MAX_LIMIT_DEFAULT;
  step_mem->dom_eig_nst       = 0;

  /* Initialize main ARKODE infrastructure */
  retval = arkInit(ark_mem, t0, y0, FIRST_INIT);
  if (retval != ARK_SUCCESS)
  {
    arkProcessError(ark_mem, retval, __LINE__, __func__, __FILE__,
                    "Unable to initialize main ARKODE infrastructure");
    ARKodeFree((void**)&ark_mem);
    return NULL;
  }

  /* Specify preferred interpolation type */
  ARKodeSetInterpolantType(ark_mem, ARK_INTERP_LAGRANGE);

  return (void*)ark_mem;
}